

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_thread_pool.h
# Opt level: O2

bool __thiscall
simple_thread_pool::ThreadPoolMgr::returnThread
          (ThreadPoolMgr *this,shared_ptr<simple_thread_pool::ThreadHandle> *t_handle)

{
  iterator iVar1;
  __hashtable *__h;
  size_t local_40;
  __shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2> local_38;
  
  std::mutex::lock(&this->idleThreadsLock);
  local_40 = ((t_handle->
              super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->myId;
  iVar1 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->idleThreads)._M_h,&local_40);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    local_40 = ((t_handle->
                super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr)->myId;
    std::__shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_38,
               &t_handle->
                super___shared_ptr<simple_thread_pool::ThreadHandle,_(__gnu_cxx::_Lock_policy)2>);
    std::
    _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>
              ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<simple_thread_pool::ThreadHandle>>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&this->idleThreads,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38._M_refcount);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->idleThreadsLock);
  return iVar1.
         super__Node_iterator_base<std::pair<const_unsigned_long,_std::shared_ptr<simple_thread_pool::ThreadHandle>_>,_false>
         ._M_cur == (__node_type *)0x0;
}

Assistant:

bool returnThread(const std::shared_ptr<ThreadHandle>& t_handle) {
        std::lock_guard<std::mutex> l(idleThreadsLock);
        auto entry = idleThreads.find(t_handle->getId());
        if (entry != idleThreads.end()) {
            return false;
        }
        idleThreads.insert({t_handle->getId(), t_handle});
        return true;
    }